

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

QSize __thiscall QMdi::ControlLabel::sizeHint(ControlLabel *this)

{
  long lVar1;
  QSize QVar2;
  long in_FS_OFFSET;
  QSizeF *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPixmap::deviceIndependentSize();
  QVar2 = QSizeF::toSize(in_stack_ffffffffffffffe0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize ControlLabel::sizeHint() const
{
    return label.deviceIndependentSize().toSize();
}